

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O3

_Bool sx_os_copy(char *src,char *dest)

{
  int __fd;
  int __out_fd;
  ssize_t sVar1;
  _Bool _Var2;
  stat src_stat;
  stat local_b0;
  
  _Var2 = false;
  __fd = open(src,0);
  if (__fd != -1) {
    fstat(__fd,&local_b0);
    __out_fd = open(dest,0x41,(ulong)(local_b0.st_mode | 0x20000));
    if (__out_fd == -1) {
      close(__fd);
      _Var2 = false;
    }
    else {
      sVar1 = sendfile(__out_fd,__fd,(off_t *)0x0,local_b0.st_size);
      close(__fd);
      close(__out_fd);
      _Var2 = -1 < (int)sVar1;
    }
  }
  return _Var2;
}

Assistant:

bool sx_os_copy(const char* src, const char* dest)
{
#if SX_PLATFORM_WINDOWS
    return CopyFileA(src, dest, FALSE) ? true : false;
#elif SX_PLATFORM_APPLE
    return copyfile(src, dest, NULL, COPYFILE_ALL | COPYFILE_NOFOLLOW_DST) == 0;
#elif SX_PLATFORM_LINUX || SX_PLATFORM_ANDROID || SX_PLATFORM_RPI
    // Reference: http://www.informit.com/articles/article.aspx?p=23618&seqNum=13
    int input, output;
    struct stat src_stat;
    if ((input = open(src, O_RDONLY)) == -1) {
        return false;
    }
    fstat(input, &src_stat);

    if ((output = open(dest, O_WRONLY | O_CREAT, O_NOFOLLOW | src_stat.st_mode)) == -1) {
        close(input);
        return false;
    }

    int result = sendfile(output, input, NULL, src_stat.st_size);
    close(input);
    close(output);
    return result > -1;
#else
    sx_assert(0, "not implemented");
    return false;
#endif
}